

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# summarycalc.cpp
# Opt level: O2

void __thiscall summarycalc::dosummaryprocessing(summarycalc *this,int samplesize)

{
  pointer piVar1;
  int event_id;
  int item_id;
  size_t sVar2;
  bool bVar3;
  int coverage_or_output_id;
  OASIS_FLOAT local_54;
  sampleslevelRec sr;
  fmlevelhdr fh;
  
  alloc_sssl_array(this,samplesize);
  reset_sssl_array(this,samplesize);
  alloc_sse_array(this);
  reset_sse_array(this);
  outputsamplesize(this,samplesize);
  bVar3 = false;
LAB_001039a8:
  sVar2 = fread(&fh,8,1,_stdin);
  item_id = fh.output_id;
  event_id = fh.event_id;
  if ((int)sVar2 != 1) {
    if (bVar3) {
      outputsummary(this,samplesize,fh.event_id);
      return;
    }
    return;
  }
  piVar1 = (this->item_to_coverage_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  coverage_or_output_id = fh.output_id;
  if ((this->item_to_coverage_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish != piVar1) {
    coverage_or_output_id = piVar1[fh.output_id];
  }
  if (!bVar3) {
    bVar3 = true;
  }
  local_54 = 0.0;
switchD_00103a40_caseD_fffffffc:
  sVar2 = fread(&sr,8,1,_stdin);
  if ((int)sVar2 == 0) goto switchD_00103a40_caseD_0;
  switch(sr.sidx) {
  case 0:
    break;
  case -5:
    dosummary_maxloss(this,samplesize,event_id,coverage_or_output_id,-5,sr.loss);
  case -4:
    goto switchD_00103a40_caseD_fffffffc;
  case -3:
    local_54 = sr.loss;
    goto switchD_00103a40_caseD_fffffffc;
  default:
    dosummary(this,samplesize,event_id,item_id,coverage_or_output_id,sr.sidx,sr.loss,local_54);
    goto switchD_00103a40_caseD_fffffffc;
  }
switchD_00103a40_caseD_0:
  goto LAB_001039a8;
}

Assistant:

void summarycalc::dosummaryprocessing(int samplesize)
{
	alloc_sssl_array(samplesize);
	reset_sssl_array(samplesize);
	alloc_sse_array();
	reset_sse_array();
	outputsamplesize(samplesize);
	fmlevelhdr fh;	
	bool havedata = false;
	int i = 1;
	while ((i = (int)fread(&fh, sizeof(fh), 1, stdin)) == 1) {
		OASIS_FLOAT expure_val = 0;
		int cov_id = getcovid(fh.output_id);
		if (i > 0 && havedata == false) havedata = true;
		while (i != 0) {
			sampleslevelRec sr;
			i = (int)fread(&sr, sizeof(sr), 1, stdin);
			if (i == 0) break;
			if (sr.sidx == 0) break;
			if (sr.sidx == number_of_affected_risk_idx) continue;
			if (sr.sidx == tiv_idx) {
				expure_val = sr.loss;
			} else if (sr.sidx == max_loss_idx) {
				dosummary_maxloss(samplesize, fh.event_id,
						  cov_id, sr.sidx, sr.loss);
			} else {
				dosummary(samplesize, fh.event_id, fh.output_id,
					  cov_id, sr.sidx, sr.loss, expure_val);
			}
		}
	}
	if (havedata) outputsummary(samplesize, fh.event_id);
}